

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.h
# Opt level: O1

void pbrt::VolPathIntegrator::rescale
               (SampledSpectrum *beta,SampledSpectrum *pdfLight,SampledSpectrum *pdfUni)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int i;
  long lVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  Float m;
  undefined1 auVar9 [16];
  Float m_1;
  undefined1 auVar11 [64];
  Float m_2;
  undefined1 auVar12 [64];
  undefined1 auVar10 [64];
  
  fVar5 = (beta->values).values[0];
  auVar10 = ZEXT464((uint)fVar5);
  lVar4 = 1;
  auVar9 = ZEXT416((uint)fVar5);
  do {
    auVar9 = vmaxss_avx(ZEXT416((uint)(beta->values).values[lVar4]),auVar9);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  fVar8 = 5.9604645e-08;
  fVar5 = 5.9604645e-08;
  fVar6 = 5.9604645e-08;
  fVar7 = 5.9604645e-08;
  if (auVar9._0_4_ <= 16777216.0) {
    fVar1 = (pdfLight->values).values[0];
    auVar11 = ZEXT464((uint)fVar1);
    lVar4 = 1;
    auVar9 = ZEXT416((uint)fVar1);
    do {
      auVar9 = vmaxss_avx(ZEXT416((uint)(pdfLight->values).values[lVar4]),auVar9);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    if (auVar9._0_4_ <= 16777216.0) {
      fVar1 = (pdfUni->values).values[0];
      auVar12 = ZEXT464((uint)fVar1);
      lVar4 = 1;
      auVar9 = ZEXT416((uint)fVar1);
      do {
        auVar9 = vmaxss_avx(ZEXT416((uint)(pdfUni->values).values[lVar4]),auVar9);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      if (auVar9._0_4_ <= 16777216.0) {
        lVar4 = 1;
        do {
          auVar9 = vmaxss_avx(ZEXT416((uint)(beta->values).values[lVar4]),auVar10._0_16_);
          auVar10 = ZEXT1664(auVar9);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 4);
        fVar8 = 16777216.0;
        fVar5 = 16777216.0;
        fVar6 = 16777216.0;
        fVar7 = 16777216.0;
        if (5.9604645e-08 <= auVar9._0_4_) {
          lVar4 = 1;
          do {
            auVar9 = vmaxss_avx(ZEXT416((uint)(pdfLight->values).values[lVar4]),auVar11._0_16_);
            auVar11 = ZEXT1664(auVar9);
            lVar4 = lVar4 + 1;
          } while (lVar4 != 4);
          if (5.9604645e-08 <= auVar9._0_4_) {
            lVar4 = 1;
            do {
              auVar9 = vmaxss_avx(ZEXT416((uint)(pdfUni->values).values[lVar4]),auVar12._0_16_);
              auVar12 = ZEXT1664(auVar9);
              lVar4 = lVar4 + 1;
            } while (lVar4 != 4);
            if (5.9604645e-08 <= auVar9._0_4_) {
              return;
            }
          }
        }
      }
    }
  }
  fVar1 = (beta->values).values[1];
  fVar2 = (beta->values).values[2];
  fVar3 = (beta->values).values[3];
  (beta->values).values[0] = fVar5 * (beta->values).values[0];
  (beta->values).values[1] = fVar6 * fVar1;
  (beta->values).values[2] = fVar7 * fVar2;
  (beta->values).values[3] = fVar8 * fVar3;
  fVar1 = (pdfLight->values).values[1];
  fVar2 = (pdfLight->values).values[2];
  fVar3 = (pdfLight->values).values[3];
  (pdfLight->values).values[0] = fVar5 * (pdfLight->values).values[0];
  (pdfLight->values).values[1] = fVar6 * fVar1;
  (pdfLight->values).values[2] = fVar7 * fVar2;
  (pdfLight->values).values[3] = fVar8 * fVar3;
  fVar1 = (pdfUni->values).values[1];
  fVar2 = (pdfUni->values).values[2];
  fVar3 = (pdfUni->values).values[3];
  (pdfUni->values).values[0] = fVar5 * (pdfUni->values).values[0];
  (pdfUni->values).values[1] = fVar6 * fVar1;
  (pdfUni->values).values[2] = fVar7 * fVar2;
  (pdfUni->values).values[3] = fVar8 * fVar3;
  return;
}

Assistant:

PBRT_CPU_GPU
    Float MaxComponentValue() const {
        Float m = values[0];
        for (int i = 1; i < NSpectrumSamples; ++i)
            m = std::max(m, values[i]);
        return m;
    }